

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O2

void borg_prepare_book_info(void)

{
  wchar_t wVar1;
  char *__s2;
  player *p;
  borg_magic *pbVar2;
  borg_spell_rating *pbVar3;
  _Bool _Var4;
  int iVar5;
  player_class *ppVar6;
  class_spell_conflict *pcVar7;
  char *pcVar8;
  uint uVar9;
  wchar_t *pwVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  long lVar13;
  
  ppVar6 = player->class;
  uVar9 = ppVar6->cidx - 1;
  if (uVar9 < 8) {
    borg_spell_ratings = (borg_spell_rating *)(&PTR_borg_spell_ratings_MAGE_002d2740)[uVar9];
    if (borg_magics != (borg_magic *)0x0) {
      mem_free(borg_magics);
      ppVar6 = player->class;
    }
    borg_magics = (borg_magic *)mem_zalloc((long)(ppVar6->magic).total_spells << 5);
    for (lVar13 = 0; pbVar2 = borg_magics, lVar13 < (player->class->magic).total_spells;
        lVar13 = lVar13 + 1) {
      pcVar7 = spell_by_index(player,(wchar_t)lVar13);
      pbVar3 = borg_spell_ratings;
      pcVar8 = pcVar7->name;
      __s2 = borg_spell_ratings[lVar13].name;
      iVar5 = strcmp(pcVar8,__s2);
      if (iVar5 == 0) {
        pbVar2[lVar13].rating = pbVar3[lVar13].rating;
        pbVar2[lVar13].name = __s2;
        pbVar2[lVar13].spell_enum = pbVar3[lVar13].spell_enum;
        pbVar2[lVar13].level = (uint8_t)pcVar7->slevel;
        p = player;
        wVar1 = pcVar7->sidx;
        iVar5 = -1;
        if ((L'\xffffffff' < wVar1) && (wVar1 < (player->class->magic).total_spells)) {
          pwVar10 = &((player->class->magic).books)->num_spells;
          wVar12 = L'\0';
          do {
            wVar11 = wVar12;
            wVar12 = *pwVar10 + wVar11;
            pwVar10 = pwVar10 + 8;
          } while (wVar12 <= wVar1);
          iVar5 = wVar1 - wVar11;
        }
        pbVar2[lVar13].book_offset = iVar5;
        pbVar2[lVar13].effect_index = pcVar7->effect->index;
        pbVar2[lVar13].power = (uint8_t)pcVar7->smana;
        pbVar2[lVar13].sfail = (uint8_t)pcVar7->sfail;
        _Var4 = spell_okay_to_cast(p,(wchar_t)lVar13);
        pbVar2[lVar13].status = _Var4;
        pbVar2[lVar13].times = 0;
        pbVar2[lVar13].book = pcVar7->bidx;
      }
      else {
        pcVar8 = format("**STARTUP FAILURE** spell definition mismatch. <%s> not the same as <%s>",
                        pcVar8,__s2);
        borg_note(pcVar8);
        borg_init_failure = true;
      }
    }
  }
  else {
    borg_spell_ratings = (borg_spell_rating *)0x0;
  }
  return;
}

Assistant:

void borg_prepare_book_info(void)
{
    switch (player->class->cidx) {
    case CLASS_MAGE:
        borg_spell_ratings = borg_spell_ratings_MAGE;
        break;
    case CLASS_DRUID:
        borg_spell_ratings = borg_spell_ratings_DRUID;
        break;
    case CLASS_PRIEST:
        borg_spell_ratings = borg_spell_ratings_PRIEST;
        break;
    case CLASS_NECROMANCER:
        borg_spell_ratings = borg_spell_ratings_NECROMANCER;
        break;
    case CLASS_PALADIN:
        borg_spell_ratings = borg_spell_ratings_PALADIN;
        break;
    case CLASS_ROGUE:
        borg_spell_ratings = borg_spell_ratings_ROGUE;
        break;
    case CLASS_RANGER:
        borg_spell_ratings = borg_spell_ratings_RANGER;
        break;
    case CLASS_BLACKGUARD:
        borg_spell_ratings = borg_spell_ratings_BLACKGUARD;
        break;
    default:
        borg_spell_ratings = NULL;
        return;
    }

    if (borg_magics)
        mem_free(borg_magics);

    borg_magics
        = mem_zalloc(player->class->magic.total_spells * sizeof(borg_magic));

    for (int spell = 0; spell < player->class->magic.total_spells; spell++) {
        borg_init_spell(borg_magics, spell);
    }
}